

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O0

int llmsset_rehash_bucket(llmsset_t dbs,uint64_t d_idx)

{
  ulong *puVar1;
  ulong uVar2;
  uint64_t a_00;
  uint64_t b_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t v;
  uint64_t *bucket;
  uint64_t last;
  uint64_t idx;
  int i;
  uint64_t new_v;
  uint64_t step;
  ulong uStack_38;
  int custom;
  uint64_t hash_rehash;
  uint64_t b;
  uint64_t a;
  uint64_t *d_ptr;
  uint64_t d_idx_local;
  llmsset_t dbs_local;
  
  a_00 = *(uint64_t *)(dbs->data + d_idx * 0x10);
  b_00 = *(uint64_t *)((long)(dbs->data + d_idx * 0x10) + 8);
  iVar3 = is_custom_bucket(dbs,d_idx);
  if (iVar3 == 0) {
    uStack_38 = sylvan_tabhash16(a_00,b_00,0xcbf29ce484222325);
  }
  else {
    uStack_38 = (*dbs->hash_cb)(a_00,b_00,0xcbf29ce484222325);
  }
  uVar4 = uStack_38 >> 0x14;
  uVar5 = uStack_38 & 0xffffff0000000000;
  idx._4_4_ = 0;
  bucket = (uint64_t *)(uStack_38 & dbs->mask);
  last = (uint64_t)bucket;
  do {
    puVar1 = dbs->table + last;
    if (*puVar1 == 0) {
      LOCK();
      uVar2 = *puVar1;
      if (uVar2 == 0) {
        *puVar1 = uVar5 | d_idx;
      }
      UNLOCK();
      if (uVar2 == 0) {
        return 1;
      }
    }
    last = last & 0xfffffffffffffff8 | last + 1 & 7;
    if ((uint64_t *)last == bucket) {
      idx._4_4_ = idx._4_4_ + 1;
      if (idx._4_4_ == dbs->threshold) {
        LOCK();
        dbs->threshold = dbs->threshold + 1;
        UNLOCK();
      }
      uStack_38 = (uVar4 | 1) * 8 + uStack_38;
      bucket = (uint64_t *)(uStack_38 & dbs->mask);
      last = (uint64_t)bucket;
    }
  } while( true );
}

Assistant:

int
llmsset_rehash_bucket(const llmsset_t dbs, uint64_t d_idx)
{
    const uint64_t * const d_ptr = ((uint64_t*)dbs->data) + 2*d_idx;
    const uint64_t a = d_ptr[0];
    const uint64_t b = d_ptr[1];

    uint64_t hash_rehash = 14695981039346656037LLU;
    const int custom = is_custom_bucket(dbs, d_idx) ? 1 : 0;
    if (custom) hash_rehash = dbs->hash_cb(a, b, hash_rehash);
    else hash_rehash = sylvan_tabhash16(a, b, hash_rehash);
    const uint64_t step = (((hash_rehash >> 20) | 1) << 3);
    const uint64_t new_v = (hash_rehash & MASK_HASH) | d_idx;
    int i=0;

    uint64_t idx, last;
#if LLMSSET_MASK
    last = idx = hash_rehash & dbs->mask;
#else
    last = idx = hash_rehash % dbs->table_size;
#endif

    for (;;) {
        _Atomic(uint64_t)* bucket = &dbs->table[idx];
        uint64_t v = atomic_load_explicit(bucket, memory_order_acquire);
        if (v == 0 && atomic_compare_exchange_strong(bucket, &v, new_v)) return 1;

        // find next idx on probe sequence
        idx = (idx & CL_MASK) | ((idx+1) & CL_MASK_R);
        if (idx == last) {
            if (++i == atomic_load_explicit(&dbs->threshold, memory_order_relaxed)) {
                // failed to find empty spot in probe sequence
                // solution: increase probe sequence length...
                atomic_fetch_add(&dbs->threshold, 1);
            }

            // go to next cache line in probe sequence
            hash_rehash += step;

#if LLMSSET_MASK
            last = idx = hash_rehash & dbs->mask;
#else
            last = idx = hash_rehash % dbs->table_size;
#endif
        }
    }
}